

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_adapt.c
# Opt level: O2

int arkAdapt(void *arkode_mem,ARKodeHAdaptMem hadapt_mem,N_Vector ycur,realtype tcur,realtype hcur,
            realtype dsm,long nst)

{
  int iVar1;
  char *msgfmt;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ulong in_XMM1_Qb;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double local_78;
  realtype h_cfl;
  realtype local_68;
  ulong uStack_60;
  realtype local_58;
  ulong uStack_50;
  double local_48;
  realtype local_40;
  double local_38;
  ulong uStack_30;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar1 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    goto LAB_004c2356;
  }
  if (hadapt_mem->imethod + 1U < 7) {
    local_48 = hadapt_mem->bias * dsm;
    iVar1 = *(int *)((long)hadapt_mem->hhist + (ulong)(hadapt_mem->pq == 0) * 4 + 0x60);
    local_68 = tcur;
    local_58 = hcur;
    uStack_50 = in_XMM1_Qb;
    local_40 = dsm;
    switch(hadapt_mem->imethod) {
    case 0:
      arkAdaptPID(hadapt_mem,iVar1,hcur,local_48,&local_78);
      break;
    case 1:
      arkAdaptPI(hadapt_mem,iVar1,hcur,local_48,&local_78);
      break;
    case 2:
      arkAdaptI(hadapt_mem,iVar1,hcur,local_48,&local_78);
      break;
    case 3:
      arkAdaptExpGus(hadapt_mem,iVar1,nst,hcur,local_48,&local_78);
      break;
    case 4:
      arkAdaptImpGus(hadapt_mem,iVar1,nst,hcur,local_48,&local_78);
      break;
    case 5:
      arkAdaptImExGus(hadapt_mem,iVar1,nst,hcur,local_48,&local_78);
      break;
    case -1:
      iVar1 = (*hadapt_mem->HAdapt)
                        (ycur,tcur,hcur,hadapt_mem->hhist[0],hadapt_mem->hhist[1],local_48,
                         hadapt_mem->ehist[0],hadapt_mem->ehist[1],hadapt_mem->q,hadapt_mem->p,
                         &local_78,hadapt_mem->HAdapt_data);
      if (iVar1 != 0) {
        msgfmt = "Error in accuracy-based adaptivity function.";
        goto LAB_004c2350;
      }
    }
    iVar1 = (*hadapt_mem->expstab)(ycur,local_68,&h_cfl,hadapt_mem->estab_data);
    if (iVar1 == 0) {
      local_38 = ABS(local_58);
      uStack_30 = uStack_50 & 0x7fffffffffffffff;
      if (h_cfl <= 0.0) {
        h_cfl = local_38 * 1e+30;
      }
      local_68 = local_58 / local_38;
      uStack_60 = uStack_50;
      if (*(int *)((long)arkode_mem + 0x200) == 0) {
        bVar2 = true;
      }
      else {
        fprintf(*(FILE **)((long)arkode_mem + 0x208),
                "ARKadapt  adapt  %.16g  %.16g  %.16g  %.16g  %.16g  %.16g  %.16g  %.16g  ",local_48
                ,hadapt_mem->ehist[0],hadapt_mem->ehist[1],local_58,hadapt_mem->hhist[0],
                hadapt_mem->hhist[1],local_78);
        bVar2 = *(int *)((long)arkode_mem + 0x200) == 0;
      }
      h_cfl = hadapt_mem->cfl * local_68 * h_cfl;
      dVar3 = ABS(local_78 * hadapt_mem->safety);
      dVar4 = ABS(local_58 * hadapt_mem->etamax);
      if (dVar4 <= dVar3) {
        dVar3 = dVar4;
      }
      dVar5 = ABS(local_58 * hadapt_mem->etamin);
      dVar4 = ABS(dVar3 * local_68);
      if (ABS(dVar3 * local_68) <= dVar5) {
        dVar4 = dVar5;
      }
      local_78 = dVar4 * local_68;
      if (!bVar2) {
        fprintf(*(FILE **)((long)arkode_mem + 0x208),"%.16g  %.16g  ");
      }
      dVar4 = ABS(local_78);
      dVar5 = ABS(h_cfl);
      dVar3 = dVar4;
      if (dVar5 <= dVar4) {
        dVar3 = dVar5;
      }
      hadapt_mem->hhist[(ulong)(dVar5 <= dVar4) + 0x10] =
           (realtype)((long)hadapt_mem->hhist[(ulong)(dVar5 <= dVar4) + 0x10] + 1);
      local_78 = local_68 * dVar3;
      if (((local_40 <= 1.0) && (ABS(hadapt_mem->lbound * local_58 * 0.999999) < ABS(local_78))) &&
         (ABS(local_78) < ABS(hadapt_mem->ubound * local_58 * 1.000001))) {
        local_78 = local_58;
      }
      auVar6._8_8_ = *(undefined8 *)((long)arkode_mem + 0x170);
      auVar6._0_8_ = local_78;
      auVar7._8_8_ = local_38;
      auVar7._0_8_ = local_58;
      auVar7 = divpd(auVar6,auVar7);
      dVar3 = auVar7._0_8_;
      if (auVar7._0_8_ <= auVar7._8_8_) {
        dVar3 = auVar7._8_8_;
      }
      dVar5 = *(double *)((long)arkode_mem + 0x178) * local_38 * dVar3;
      dVar4 = 1.0;
      if (1.0 <= dVar5) {
        dVar4 = dVar5;
      }
      *(double *)((long)arkode_mem + 400) = dVar3 / dVar4;
      if (*(int *)((long)arkode_mem + 0x200) == 0) {
        return 0;
      }
      fprintf(*(FILE **)((long)arkode_mem + 0x208),"%.16g\n",dVar3 / dVar4);
      return 0;
    }
    msgfmt = "Error in explicit stability function.";
  }
  else {
    msgfmt = "Illegal imethod.";
  }
LAB_004c2350:
  iVar1 = -0x16;
LAB_004c2356:
  arkProcessError((ARKodeMem)arkode_mem,iVar1,"ARKode","arkAdapt",msgfmt);
  return iVar1;
}

Assistant:

int arkAdapt(void* arkode_mem, ARKodeHAdaptMem hadapt_mem,
             N_Vector ycur, realtype tcur, realtype hcur,
             realtype dsm, long int nst)
{
  int ier, k;
  realtype ecur, h_acc, h_cfl, int_dir;
  ARKodeMem ark_mem;
  if (arkode_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkAdapt", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* Current error with bias factor */
  ecur = hadapt_mem->bias * dsm;

  /* Set k as either p or q, based on pq flag */
  k = (hadapt_mem->pq) ? hadapt_mem->q : hadapt_mem->p;

  /* Call algorithm-specific error adaptivity method */
  switch (hadapt_mem->imethod) {
  case(ARK_ADAPT_PID):         /* PID controller */
    ier = arkAdaptPID(hadapt_mem, k, hcur, ecur, &h_acc);
    break;
  case(ARK_ADAPT_PI):          /* PI controller */
    ier = arkAdaptPI(hadapt_mem, k, hcur, ecur, &h_acc);
    break;
  case(ARK_ADAPT_I):           /* I controller */
    ier = arkAdaptI(hadapt_mem, k, hcur, ecur, &h_acc);
    break;
  case(ARK_ADAPT_EXP_GUS):     /* explicit Gustafsson controller */
    ier = arkAdaptExpGus(hadapt_mem, k, nst, hcur, ecur, &h_acc);
    break;
  case(ARK_ADAPT_IMP_GUS):     /* implicit Gustafsson controller */
    ier = arkAdaptImpGus(hadapt_mem, k, nst, hcur, ecur, &h_acc);
    break;
  case(ARK_ADAPT_IMEX_GUS):    /* imex Gustafsson controller */
    ier = arkAdaptImExGus(hadapt_mem, k, nst, hcur, ecur, &h_acc);
    break;
  case(ARK_ADAPT_CUSTOM):      /* user-supplied controller */
    ier = hadapt_mem->HAdapt(ycur, tcur, hcur, hadapt_mem->hhist[0],
                             hadapt_mem->hhist[1], ecur,
                             hadapt_mem->ehist[0],
                             hadapt_mem->ehist[1],
                             hadapt_mem->q, hadapt_mem->p,
                             &h_acc, hadapt_mem->HAdapt_data);
    break;
  default:
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkAdapt",
                    "Illegal imethod.");
    return (ARK_ILL_INPUT);
  }
  if (ier != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkAdapt",
                    "Error in accuracy-based adaptivity function.");
    return (ARK_ILL_INPUT);
  }

  /* determine direction of integration */
  int_dir = hcur / SUNRabs(hcur);

  /* Call explicit stability function */
  ier = hadapt_mem->expstab(ycur, tcur, &h_cfl, hadapt_mem->estab_data);
  if (ier != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode", "arkAdapt",
                    "Error in explicit stability function.");
    return (ARK_ILL_INPUT);
  }
  if (h_cfl <= ZERO)  h_cfl = RCONST(1.0e30) * SUNRabs(hcur);

  /* Solver diagnostics reporting */
  if (ark_mem->report)
    fprintf(ark_mem->diagfp, "ARKadapt  adapt  %"RSYM"  %"RSYM"  %"RSYM"  %"RSYM"  %"RSYM"  %"RSYM"  %"RSYM"  %"RSYM"  ",
            ecur, hadapt_mem->ehist[0], hadapt_mem->ehist[1],
            hcur, hadapt_mem->hhist[0], hadapt_mem->hhist[1], h_acc, h_cfl);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                     "ARKODE::arkAdapt", "error-history",
                     "ecur = %"RSYM", ehist[0] = %"RSYM", ehist[0] = %"RSYM,
                     ecur, hadapt_mem->ehist[0], hadapt_mem->ehist[1]);

  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                     "ARKODE::arkAdapt", "step-history",
                     "hcur = %"RSYM", hhist[0] = %"RSYM", hhist[0] = %"RSYM,
                     hcur, hadapt_mem->hhist[0], hadapt_mem->hhist[1]);

  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                     "ARKODE::arkAdapt", "new-step-before-bounds",
                     "h_acc = %"RSYM", h_cfl = %"RSYM, h_acc, h_cfl);
#endif

  /* enforce safety factors */
  h_acc *= hadapt_mem->safety;
  h_cfl *= hadapt_mem->cfl * int_dir;

  /* enforce maximum bound on time step growth */
  h_acc = int_dir * SUNMIN(SUNRabs(h_acc), SUNRabs(hadapt_mem->etamax*hcur));

  /* enforce minimum bound time step reduction */
  h_acc = int_dir * SUNMAX(SUNRabs(h_acc), SUNRabs(hadapt_mem->etamin*hcur));

  /* Solver diagnostics reporting */
  if (ark_mem->report)
    fprintf(ark_mem->diagfp, "%"RSYM"  %"RSYM"  ", h_acc, h_cfl);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                     "ARKODE::arkAdapt", "new-step-after-max-min-bounds",
                     "h_acc = %"RSYM", h_cfl = %"RSYM, h_acc, h_cfl);
#endif

  /* increment the relevant step counter, set desired step */
  if (SUNRabs(h_acc) < SUNRabs(h_cfl))
    hadapt_mem->nst_acc++;
  else
    hadapt_mem->nst_exp++;
  h_acc = int_dir * SUNMIN(SUNRabs(h_acc), SUNRabs(h_cfl));

  /* enforce adaptivity bounds to retain Jacobian/preconditioner accuracy */
  if (dsm <= ONE) {
    if ( (SUNRabs(h_acc) > SUNRabs(hcur*hadapt_mem->lbound*ONEMSM)) &&
         (SUNRabs(h_acc) < SUNRabs(hcur*hadapt_mem->ubound*ONEPSM)) )
      h_acc = hcur;
  }

  /* set basic value of ark_eta */
  ark_mem->eta = h_acc / hcur;

  /* enforce minimum time step size */
  ark_mem->eta = SUNMAX(ark_mem->eta,
                        ark_mem->hmin / SUNRabs(hcur));

  /* enforce maximum time step size */
  ark_mem->eta /= SUNMAX(ONE, SUNRabs(hcur) *
                         ark_mem->hmax_inv*ark_mem->eta);

  /* Solver diagnostics reporting */
  if (ark_mem->report)
    fprintf(ark_mem->diagfp, "%"RSYM"\n", ark_mem->eta);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO, "ARKODE::arkAdapt",
                     "new-step-eta", "eta = %"RSYM, ark_mem->eta);
#endif

  return(ier);
}